

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcBlast.c
# Opt level: O1

void Wlc_BlastAdderFast(Gia_Man_t *pNew,int *pAdd0,int *pAdd1,int nBits,int fSign,int CarryIn)

{
  size_t __n;
  uint uVar1;
  int Log2;
  int *pAdd0_00;
  int *pAdd1_00;
  uint uVar2;
  ulong uVar3;
  int iVar4;
  
  Log2 = nBits;
  if (1 < (uint)nBits) {
    uVar1 = nBits - 1;
    if (uVar1 == 0) {
      Log2 = 0;
    }
    else {
      uVar2 = 0x1f;
      if (uVar1 != 0) {
        for (; uVar1 >> uVar2 == 0; uVar2 = uVar2 - 1) {
        }
      }
      Log2 = (uVar2 ^ 0xffffffe0) + 0x21;
    }
  }
  uVar1 = 1 << ((byte)Log2 & 0x1f);
  pAdd0_00 = (int *)calloc((long)(int)(uVar1 + 1),4);
  pAdd1_00 = (int *)calloc((long)(int)(uVar1 + 1),4);
  if (nBits < 1) {
    uVar2 = 0;
  }
  else {
    __n = (ulong)(uint)nBits * 4;
    memcpy(pAdd0_00,pAdd0,__n);
    memcpy(pAdd1_00,pAdd1,__n);
    uVar2 = nBits;
  }
  if ((int)uVar2 < (int)uVar1) {
    uVar3 = (ulong)uVar2;
    do {
      if (fSign == 0) {
        pAdd0_00[uVar3] = 0;
        iVar4 = 0;
      }
      else {
        pAdd0_00[uVar3] = pAdd0[(long)nBits + -1];
        iVar4 = pAdd1[(long)nBits + -1];
      }
      pAdd1_00[uVar3] = iVar4;
      uVar3 = uVar3 + 1;
    } while (uVar1 != uVar3);
  }
  Wlc_BlastAdderFast_int(pNew,pAdd0_00,pAdd1_00,Log2,CarryIn);
  if (-1 < nBits) {
    memcpy(pAdd0,pAdd0_00,(ulong)(uint)nBits * 4 + 4);
  }
  if (pAdd0_00 != (int *)0x0) {
    free(pAdd0_00);
  }
  if (pAdd1_00 != (int *)0x0) {
    free(pAdd1_00);
    return;
  }
  return;
}

Assistant:

void Wlc_BlastAdderFast( Gia_Man_t * pNew, int * pAdd0, int * pAdd1, int nBits, int fSign, int CarryIn ) // result is in pAdd0
{
    int i, Log2 = Abc_Base2Log(nBits);
    int * pAdd0n = ABC_CALLOC( int, (1<<Log2)+1 );
    int * pAdd1n = ABC_CALLOC( int, (1<<Log2)+1 );
    for ( i = 0; i < nBits; i++ )
    {
        pAdd0n[i] = pAdd0[i];
        pAdd1n[i] = pAdd1[i];
    }
    for ( ; i < (1<<Log2); i++ )
    {
        pAdd0n[i] = fSign ? pAdd0[nBits-1] : 0;
        pAdd1n[i] = fSign ? pAdd1[nBits-1] : 0;
    }
    Wlc_BlastAdderFast_int( pNew, pAdd0n, pAdd1n, Log2, CarryIn );
    for ( i = 0; i <= nBits; i++ )
        pAdd0[i] = pAdd0n[i];
    ABC_FREE(pAdd0n);
    ABC_FREE(pAdd1n);
}